

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::AbstractNumericValidator::getCanonicalRepresentation
          (AbstractNumericValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  MemoryManager *local_60;
  AbstractNumericValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  AbstractNumericValidator *this_local;
  
  local_60 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_60 = (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.fMemoryManager;
  }
  if (toValidate) {
    (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,rawData,0,0,local_60);
  }
  pXVar1 = XMLAbstractDoubleFloat::getCanonicalRepresentation(rawData,local_60);
  return pXVar1;
}

Assistant:

const XMLCh* AbstractNumericValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                 ,      MemoryManager* const memMgr
                                                                 ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        AbstractNumericValidator* temp = (AbstractNumericValidator*) this;

        try 
        {
            temp->checkContent(rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }

    // XMLAbstractDoubleFloat::getCanonicalRepresentation handles
    // exceptional cases
    return XMLAbstractDoubleFloat::getCanonicalRepresentation(rawData, toUse);

}